

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O1

Res __thiscall Ptex::v2_2::PtexWriterBase::calcTileRes(PtexWriterBase *this,Res faceres)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  iVar4 = ((1 << (faceres.ulog2 & 0x1fU)) << (faceres.vlog2 & 0x1fU)) * this->_pixelSize;
  iVar2 = iVar4 + 0xffff;
  if (-1 < iVar4) {
    iVar2 = iVar4;
  }
  uVar5 = (uint)(iVar2 >> 0x10) >> 1 | iVar2 >> 0x10;
  uVar5 = uVar5 >> 2 | uVar5;
  uVar5 = uVar5 >> 4 | uVar5;
  uVar5 = uVar5 >> 8 | uVar5;
  uVar5 = uVar5 >> 1 | uVar5 >> 0x11;
  uVar5 = (uVar5 >> 1 & 0x15555555) + (uVar5 & 0x55555555);
  uVar5 = (uVar5 >> 2 & 0x13333333) + (uVar5 & 0x33333333);
  uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
  uVar5 = (uVar5 >> 8) + uVar5;
  uVar5 = (uVar5 >> 0x10) + uVar5 & 0xff;
  if (uVar5 == 0) {
    uVar1 = (ushort)faceres >> 8;
  }
  else {
    iVar6 = (int)faceres.ulog2;
    iVar3 = (int)faceres.vlog2;
    iVar4 = (iVar3 + iVar6) - uVar5;
    iVar2 = (iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1;
    if (iVar6 <= iVar2) {
      iVar2 = iVar6;
    }
    faceres = SUB42(iVar2,0);
    iVar4 = iVar4 - (char)iVar2;
    if (iVar3 <= iVar4) {
      iVar4 = iVar3;
    }
    uVar1 = (ushort)iVar4;
  }
  return (Res)((ushort)faceres & 0xff | uVar1 << 8);
}

Assistant:

Ptex::Res PtexWriterBase::calcTileRes(Res faceres)
{
    // desired number of tiles = floor(log2(facesize / tilesize))
    int facesize = faceres.size() * _pixelSize;
    int ntileslog2 = PtexUtils::floor_log2(facesize/TileSize);
    if (ntileslog2 == 0) return faceres;

    // number of tiles is defined as:
    //   ntileslog2 = ureslog2 + vreslog2 - (tile_ureslog2 + tile_vreslog2)
    // rearranging to solve for the tile res:
    //   tile_ureslog2 + tile_vreslog2 = ureslog2 + vreslog2 - ntileslog2
    int n = faceres.ulog2 + faceres.vlog2 - ntileslog2;

    // choose u and v sizes for roughly square result (u ~= v ~= n/2)
    // and make sure tile isn't larger than face
    Res tileres;
    tileres.ulog2 = (int8_t)PtexUtils::min(int((n+1)/2), int(faceres.ulog2));
    tileres.vlog2 = (int8_t)PtexUtils::min(int(n - tileres.ulog2), int(faceres.vlog2));
    return tileres;
}